

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_registry.c
# Opt level: O0

int curious_register_file_by_fd(int fd)

{
  size_t sVar1;
  char *local_158;
  char *mount_point;
  char *filesystem;
  size_t bytes_written;
  char local_138 [4];
  int trunc_ret;
  char buf [256];
  size_t len;
  char fd_path [22];
  int fd_local;
  
  if (fd < 0) {
    stack0xfffffffffffffff4 = -1;
  }
  else {
    len._0_1_ = '/';
    len._1_1_ = 'p';
    len._2_1_ = 'r';
    len._3_1_ = 'o';
    len._4_1_ = 'c';
    len._5_1_ = '/';
    len._6_1_ = 's';
    len._7_1_ = 'e';
    builtin_strncpy(fd_path,"lf/fd/",7);
    builtin_strncpy(fd_path + 7,"      ",7);
    fd_path._16_4_ = fd;
    sVar1 = strlen((char *)&len);
    bytes_written._4_4_ = snprintf(fd_path + (sVar1 - 8),6,"%d",(ulong)(uint)fd_path._16_4_);
    if (((int)bytes_written._4_4_ < 0) || (5 < (int)bytes_written._4_4_)) {
      fprintf(_stderr,"Warning! err code: %i. fd (%i) may be truncated in fd_path (%s)\n",
              (ulong)bytes_written._4_4_,(ulong)(uint)fd_path._16_4_,&len);
    }
    filesystem = (char *)readlink((char *)&len,local_138,0x100);
    if (filesystem < (char *)0xff) {
      local_138[(long)filesystem] = '\0';
    }
    else {
      buf[0xf7] = '\0';
    }
    curious_get_filesystem(local_138,&mount_point,&local_158);
    register0x00000000 = curious_register_file(local_138,fd_path._16_4_,mount_point,local_158);
  }
  return stack0xfffffffffffffff4;
}

Assistant:

int curious_register_file_by_fd(int fd)
{
    if (fd < 0) {
        return -1;
    }

// Setup the basic I/O files
// Assume we have at most a 6 digit file descriptor, since we can spare a few bytes
#define DIGITS 6
    char   fd_path[] = "/proc/self/fd/\0      ";
    size_t len       = strlen(fd_path);

// We make the assumption that the mount will be in the first 256 bytes,
// since that's longer than any line in /proc/mounts
#define BUF_SIZE 256
    char buf[BUF_SIZE];

    // append fd to fd_path
    int trunc_ret = snprintf(fd_path + len, DIGITS, "%d", fd);
    if (trunc_ret < 0 || trunc_ret >= DIGITS)
        fprintf(stderr, "Warning! err code: %i. fd (%i) may be truncated in fd_path (%s)\n", trunc_ret, fd, fd_path);

    // see where the link stored at fd_path goes
    size_t bytes_written = readlink(fd_path, buf, BUF_SIZE);

    // readlink doesn't add a null terminator, so we should
    if (bytes_written < BUF_SIZE - 1) {
        buf[bytes_written] = '\0';
    } else {
        buf[BUF_SIZE - 1] = '\0';
    }

    // now register the file using that path
    char* filesystem;
    char* mount_point;
    curious_get_filesystem(buf, &filesystem, &mount_point);
    return curious_register_file(buf, fd, filesystem, mount_point);
}